

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAig.c
# Opt level: O2

int Gia_ManSolveSat(Gia_Man_t *p)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  Gia_Man_t *pMan;
  Gia_Obj_t *pGVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  char **format;
  int level;
  Gia_Man_t *pGVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  
  pMan = (Gia_Man_t *)Gia_ManToAig(p,0);
  format = s_Data4 + 0xac2;
  pGVar7 = pMan;
  iVar2 = Fra_FraigSat((Aig_Man_t *)pMan,10000000,0,0,0,0,1,1,0,0);
  if (iVar2 == 0) {
    pVVar1 = pMan->vEdgeDelay;
    *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xffffffffbfffffff;
    for (uVar9 = 0; (long)uVar9 < (long)p->vCis->nSize - (long)p->nRegs; uVar9 = uVar9 + 1) {
      format = (char **)(uVar9 & 0xffffffff);
      pGVar7 = p;
      pGVar3 = Gia_ManCi(p,(int)uVar9);
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      *(ulong *)pGVar3 =
           *(ulong *)pGVar3 & 0xffffffffbfffffff | (ulong)(((&pVVar1->nCap)[uVar9] & 1U) << 0x1e);
    }
    for (uVar8 = 0; (int)uVar8 < p->nObjs; uVar8 = uVar8 + 1) {
      format = (char **)(ulong)uVar8;
      pGVar7 = p;
      pGVar3 = Gia_ManObj(p,uVar8);
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar9 = *(ulong *)pGVar3;
      bVar10 = (int)uVar9 < 0;
      format = (char **)CONCAT71((int7)((ulong)format >> 8),bVar10);
      uVar5 = uVar9 & 0x1fffffff;
      pGVar7 = (Gia_Man_t *)CONCAT71((int7)((ulong)pGVar7 >> 8),uVar5 == 0x1fffffff || bVar10);
      if (uVar5 != 0x1fffffff && !bVar10) {
        uVar6 = (uint)(uVar9 >> 0x1d) & 7 ^ *(uint *)(pGVar3 + -uVar5) >> 0x1e;
        format = (char **)(ulong)uVar6;
        uVar4 = (uint)(uVar9 >> 0x20);
        pGVar7 = (Gia_Man_t *)
                 (ulong)(((uVar4 >> 0x1d ^ *(uint *)(pGVar3 + -(ulong)(uVar4 & 0x1fffffff)) >> 0x1e)
                          & uVar6 & 1) << 0x1e);
        *(ulong *)pGVar3 = uVar9 & 0xffffffff3fffffff | (ulong)pGVar7;
      }
    }
    for (uVar8 = 0; (int)uVar8 < p->vCos->nSize - p->nRegs; uVar8 = uVar8 + 1) {
      format = (char **)(ulong)uVar8;
      pGVar7 = p;
      pGVar3 = Gia_ManCo(p,uVar8);
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar4 = (uint)*(ulong *)pGVar3;
      format = (char **)(ulong)((uVar4 * 2 ^ *(uint *)(pGVar3 + -(ulong)(uVar4 & 0x1fffffff))) &
                               0x40000000);
      *(ulong *)pGVar3 = *(ulong *)pGVar3 & 0xffffffffbfffffff | (ulong)format;
    }
    for (uVar8 = 0; level = (int)pGVar7, (int)uVar8 < p->vCos->nSize - p->nRegs; uVar8 = uVar8 + 1)
    {
      format = (char **)(ulong)uVar8;
      pGVar7 = p;
      pGVar3 = Gia_ManCo(p,uVar8);
      level = (int)pGVar7;
      if ((pGVar3 == (Gia_Obj_t *)0x0) || ((pGVar3->field_0x3 & 0x40) == 0)) break;
    }
    if (p->vCos->nSize - p->nRegs != uVar8) {
      Abc_Print(level,(char *)format);
    }
  }
  Aig_ManStop((Aig_Man_t *)pMan);
  return iVar2;
}

Assistant:

int Gia_ManSolveSat( Gia_Man_t * p )
{
//    extern int Fra_FraigSat( Aig_Man_t * pMan, ABC_INT64_T nConfLimit, ABC_INT64_T nInsLimit, int fFlipBits, int fAndOuts, int fNewSolver, int fVerbose );
    Aig_Man_t * pNew;
    int RetValue;//, clk = Abc_Clock();
    pNew = Gia_ManToAig( p, 0 );
    RetValue = Fra_FraigSat( pNew, 10000000, 0, 0, 0, 0, 1, 1, 0, 0 );
    if ( RetValue == 0 )
    {
        Gia_Obj_t * pObj;
        int i, * pInit = (int *)pNew->pData;
        Gia_ManConst0(p)->fMark0 = 0;
        Gia_ManForEachPi( p, pObj, i )
            pObj->fMark0 = pInit[i];
        Gia_ManForEachAnd( p, pObj, i )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                           (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachPo( p, pObj, i )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj));
        Gia_ManForEachPo( p, pObj, i )
            if ( pObj->fMark0 != 1 )
                break;
        if ( i != Gia_ManPoNum(p) )
            Abc_Print( 1, "Counter-example verification has failed.  " );
//        else
//            Abc_Print( 1, "Counter-example verification succeeded.  " );
    }
/*
    else if ( RetValue == 1 )
        Abc_Print( 1, "The SAT problem is unsatisfiable.  " );
    else if ( RetValue == -1 )
        Abc_Print( 1, "The SAT problem is undecided.  " );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
*/
    Aig_ManStop( pNew );
    return RetValue;
}